

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O2

errr finish_parse_act(parser *p)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  angband_constants *paVar6;
  activation *paVar7;
  undefined8 *puVar8;
  long *p_00;
  uint16_t uVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  
  z_info->act_max = 0;
  puVar8 = (undefined8 *)parser_priv(p);
  paVar6 = z_info;
  uVar9 = z_info->act_max;
  for (; puVar8 != (undefined8 *)0x0; puVar8 = (undefined8 *)*puVar8) {
    uVar9 = uVar9 + 1;
    paVar6->act_max = uVar9;
  }
  activations = (activation *)mem_zalloc((ulong)uVar9 * 0x38 + 0x38);
  p_00 = (long *)parser_priv(p);
  lVar12 = 0x70;
  iVar11 = 1;
  while (paVar7 = activations, p_00 != (long *)0x0) {
    *(long *)((long)activations + lVar12 + -8) = p_00[6];
    lVar10 = *p_00;
    lVar2 = p_00[1];
    lVar3 = p_00[2];
    lVar4 = p_00[3];
    lVar5 = p_00[5];
    plVar1 = (long *)((long)paVar7 + lVar12 + -0x18);
    *plVar1 = p_00[4];
    plVar1[1] = lVar5;
    plVar1 = (long *)((long)paVar7 + lVar12 + -0x28);
    *plVar1 = lVar3;
    plVar1[1] = lVar4;
    plVar1 = (long *)((long)&paVar7[-1].next + lVar12);
    *plVar1 = lVar10;
    plVar1[1] = lVar2;
    paVar7 = activations;
    lVar10 = (long)&activations->next + lVar12;
    *(int *)((long)activations + lVar12 + -0x28) = iVar11;
    plVar1 = (long *)*p_00;
    if (plVar1 == (long *)0x0) {
      lVar10 = 0;
    }
    *(long *)((long)&paVar7[-1].next + lVar12) = lVar10;
    mem_free(p_00);
    lVar12 = lVar12 + 0x38;
    iVar11 = iVar11 + 1;
    p_00 = plVar1;
  }
  z_info->act_max = z_info->act_max + 1;
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_act(struct parser *p) {
	struct activation *act, *next = NULL;
	int count = 1;

	/* Count the entries */
	z_info->act_max = 0;
	act = parser_priv(p);
	while (act) {
		z_info->act_max++;
		act = act->next;
	}

	/* Allocate the direct access list and copy the data to it */
	activations = mem_zalloc((z_info->act_max + 1) * sizeof(*act));
	for (act = parser_priv(p); act; act = next, count++) {
		memcpy(&activations[count], act, sizeof(*act));
		activations[count].index = count;
		next = act->next;
		if (next) {
			activations[count].next = &activations[count + 1];
		} else {
			activations[count].next = NULL;
		}
		mem_free(act);
	}
	z_info->act_max += 1;

	parser_destroy(p);
	return 0;
}